

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall Scene::~Scene(Scene *this)

{
  Material **in_RDI;
  int i_2;
  int i_1;
  int i;
  int local_14;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 1); local_c = local_c + 1) {
    safe_delete<Material>(in_RDI);
  }
  safe_array_delete<Material*>((Material ***)in_RDI);
  for (local_10 = 0; local_10 < *(int *)(in_RDI + 3); local_10 = local_10 + 1) {
    safe_delete<Texture>((Texture **)in_RDI);
  }
  safe_array_delete<Texture*>((Texture ***)in_RDI);
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 5); local_14 = local_14 + 1) {
    safe_delete<Object>((Object **)in_RDI);
  }
  safe_array_delete<Object*>((Object ***)in_RDI);
  return;
}

Assistant:

Scene::~Scene()
{
    for(int i=0; i<m_materials_size; ++i) {
        safe_delete(m_materials[i]);
    }
    safe_array_delete(m_materials);

    for(int i=0; i<m_textures_size; ++i) {
        safe_delete(m_textures[i]);
    }
    safe_array_delete(m_textures);

    for(int i=0; i<m_objects_size; ++i) {
        safe_delete(m_objects[i]);
    }
    safe_array_delete(m_objects);
}